

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiver *receiver)

{
  bool bVar1;
  uint64_t len;
  ContentReceiver *out;
  bool bVar2;
  function<bool_(const_char_*,_unsigned_long)> *this;
  Headers *headers;
  int iVar3;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  Progress *local_e0;
  int *local_d8;
  function<bool_(const_char_*,_unsigned_long)> local_d0;
  function<bool_(unsigned_long,_unsigned_long)> local_b0;
  function<bool_(const_char_*,_unsigned_long)> local_90;
  function<bool_(const_char_*,_unsigned_long)> local_70;
  string local_50;
  
  local_100._8_8_ = 0;
  local_e8 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
             ::_M_invoke;
  local_f0 = std::
             _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
             ::_M_manager;
  local_100._M_unused._M_object = receiver;
  local_e0 = progress;
  local_d8 = status;
  Response::get_header_value_abi_cxx11_(&local_50,x,"Content-Encoding",0);
  bVar1 = std::operator==(&local_50,"gzip");
  std::__cxx11::string::~string((string *)&local_50);
  iVar3 = 0x19f;
  if (!bVar1) {
    headers = &x->headers;
    bVar1 = is_chunked_transfer_encoding(headers);
    if (bVar1) {
      std::function<bool_(const_char_*,_unsigned_long)>::function
                (&local_70,(function<bool_(const_char_*,_unsigned_long)> *)&local_100);
      bVar1 = read_content_chunked((detail *)strm,(Stream *)&local_70,out);
      this = &local_70;
LAB_00182076:
      std::_Function_base::~_Function_base(&this->super__Function_base);
    }
    else {
      bVar1 = has_header(headers,"Content-Length");
      if (!bVar1) {
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  (&local_90,(function<bool_(const_char_*,_unsigned_long)> *)&local_100);
        bVar1 = read_content_without_length(strm,&local_90);
        this = &local_90;
        goto LAB_00182076;
      }
      len = get_header_value_uint64(headers,"Content-Length",0);
      if (payload_max_length < len) {
        iVar3 = 0x19d;
        skip_content_with_length(strm,len);
        goto LAB_00182089;
      }
      bVar2 = true;
      if (len == 0) goto LAB_00182093;
      std::function<bool_(unsigned_long,_unsigned_long)>::function(&local_b0,local_e0);
      std::function<bool_(const_char_*,_unsigned_long)>::function
                (&local_d0,(function<bool_(const_char_*,_unsigned_long)> *)&local_100);
      bVar1 = read_content_with_length(strm,len,&local_b0,&local_d0);
      std::_Function_base::~_Function_base(&local_d0.super__Function_base);
      std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    }
    bVar2 = true;
    iVar3 = 400;
    if (bVar1 != false) goto LAB_00182093;
  }
LAB_00182089:
  *local_d8 = iVar3;
  bVar2 = false;
LAB_00182093:
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  return bVar2;
}

Assistant:

bool read_content(Stream &strm, T &x, size_t payload_max_length, int &status,
                  Progress progress, ContentReceiver receiver) {

  ContentReceiver out = [&](const char *buf, size_t n) {
    return receiver(buf, n);
  };

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  detail::decompressor decompressor;

  if (!decompressor.is_valid()) {
    status = 500;
    return false;
  }

  if (x.get_header_value("Content-Encoding") == "gzip") {
    out = [&](const char *buf, size_t n) {
      return decompressor.decompress(
          buf, n, [&](const char *buf, size_t n) { return receiver(buf, n); });
    };
  }
#else
  if (x.get_header_value("Content-Encoding") == "gzip") {
    status = 415;
    return false;
  }
#endif

  auto ret = true;
  auto exceed_payload_max_length = false;

  if (is_chunked_transfer_encoding(x.headers)) {
    ret = read_content_chunked(strm, out);
  } else if (!has_header(x.headers, "Content-Length")) {
    ret = read_content_without_length(strm, out);
  } else {
    auto len = get_header_value_uint64(x.headers, "Content-Length", 0);
    if (len > payload_max_length) {
      exceed_payload_max_length = true;
      skip_content_with_length(strm, len);
      ret = false;
    } else if (len > 0) {
      ret = read_content_with_length(strm, len, progress, out);
    }
  }

  if (!ret) { status = exceed_payload_max_length ? 413 : 400; }

  return ret;
}